

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall
sf::Shader::loadFromFile
          (Shader *this,string *vertexShaderFilename,string *geometryShaderFilename,
          string *fragmentShaderFilename)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> geometryShader;
  vector<char,_std::allocator<char>_> vertexShader;
  vector<char,_std::allocator<char>_> *in_stack_00000130;
  string *in_stack_00000138;
  char *in_stack_00001000;
  char *in_stack_00001008;
  char *in_stack_00001010;
  Shader *in_stack_00001018;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  vector<char,_std::allocator<char>_> local_80;
  vector<char,_std::allocator<char>_> local_68;
  undefined4 local_50;
  vector<char,_std::allocator<char>_> local_40;
  string *local_28;
  string *local_20;
  string *local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x2c5e9c);
  bVar1 = anon_unknown.dwarf_3b3964::getFileContents(in_stack_00000138,in_stack_00000130);
  if (bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x2c5f8e);
    bVar1 = anon_unknown.dwarf_3b3964::getFileContents(in_stack_00000138,in_stack_00000130);
    if (bVar1) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x2c605f);
      bVar1 = anon_unknown.dwarf_3b3964::getFileContents(in_stack_00000138,in_stack_00000130);
      if (bVar1) {
        std::vector<char,_std::allocator<char>_>::operator[](&local_40,0);
        std::vector<char,_std::allocator<char>_>::operator[](&local_68,0);
        std::vector<char,_std::allocator<char>_>::operator[](&local_80,0);
        in_stack_fffffffffffffee7 =
             compile(in_stack_00001018,in_stack_00001010,in_stack_00001008,in_stack_00001000);
        local_1 = (bool)in_stack_fffffffffffffee7;
      }
      else {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to open fragment shader file \"");
        poVar2 = std::operator<<(poVar2,local_28);
        poVar2 = std::operator<<(poVar2,"\"");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_1 = false;
      }
      local_50 = 1;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to open geometry shader file \"");
      poVar2 = std::operator<<(poVar2,local_20);
      poVar2 = std::operator<<(poVar2,"\"");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = false;
      local_50 = 1;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to open vertex shader file \"");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
    local_50 = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  return (bool)(local_1 & 1);
}

Assistant:

bool Shader::loadFromFile(const std::string& vertexShaderFilename, const std::string& geometryShaderFilename, const std::string& fragmentShaderFilename)
{
    // Read the vertex shader file
    std::vector<char> vertexShader;
    if (!getFileContents(vertexShaderFilename, vertexShader))
    {
        err() << "Failed to open vertex shader file \"" << vertexShaderFilename << "\"" << std::endl;
        return false;
    }

    // Read the geometry shader file
    std::vector<char> geometryShader;
    if (!getFileContents(geometryShaderFilename, geometryShader))
    {
        err() << "Failed to open geometry shader file \"" << geometryShaderFilename << "\"" << std::endl;
        return false;
    }

    // Read the fragment shader file
    std::vector<char> fragmentShader;
    if (!getFileContents(fragmentShaderFilename, fragmentShader))
    {
        err() << "Failed to open fragment shader file \"" << fragmentShaderFilename << "\"" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], &geometryShader[0], &fragmentShader[0]);
}